

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O1

void __thiscall ClipperLib::clipperException::~clipperException(clipperException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__clipperException_009dbb70;
  pcVar1 = (this->m_descr)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_descr).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~clipperException() throw() {}